

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mutable_s2shape_index.h
# Opt level: O0

void __thiscall MutableS2ShapeIndex::UpdateState::~UpdateState(UpdateState *this)

{
  ostream *poVar1;
  S2LogMessage local_28;
  S2LogMessageVoidify local_11;
  UpdateState *local_10;
  UpdateState *this_local;
  
  if (this->num_waiting == 0) {
    return;
  }
  local_10 = this;
  S2FatalLogMessage::S2FatalLogMessage
            ((S2FatalLogMessage *)&local_28,
             "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/mutable_s2shape_index.h"
             ,0x1da,kFatal,(ostream *)&std::cerr);
  poVar1 = S2LogMessage::stream(&local_28);
  poVar1 = std::operator<<(poVar1,"Check failed: (0) == (num_waiting) ");
  S2LogMessageVoidify::operator&(&local_11,poVar1);
  S2FatalLogMessage::~S2FatalLogMessage((S2FatalLogMessage *)&local_28);
}

Assistant:

~UpdateState() {
      S2_DCHECK_EQ(0, num_waiting);
    }